

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

entity flecs::pod_component<Position>(world *world,char *name,bool allow_tag)

{
  bool bVar1;
  int iVar2;
  ecs_type_t peVar3;
  size_t size;
  size_t alignment;
  ecs_entity_t entity_00;
  world_t *pwVar4;
  void *pvVar5;
  char *pcVar6;
  entity eVar7;
  char *symbol;
  EcsName *name_comp;
  ecs_entity_t entity_1;
  ecs_entity_t entity;
  char *path;
  entity_t id;
  world_t *world_ptr;
  char *pcStack_28;
  bool allow_tag_local;
  char *name_local;
  world *world_local;
  
  world_ptr._7_1_ = allow_tag;
  pcStack_28 = name;
  name_local = (char *)world;
  if (name == (char *)0x0) {
    pcStack_28 = _::name_helper<Position>::name();
  }
  id = (entity_t)flecs::world::c_ptr((world *)name_local);
  path = (char *)0x0;
  bVar1 = _::component_info<Position>::registered();
  if (bVar1) {
    path = (char *)_::component_info<Position>::id_no_lifecycle
                             ((world_t *)id,pcStack_28,(bool)(world_ptr._7_1_ & 1));
    peVar3 = ecs_get_type((ecs_world_t *)id,(ecs_entity_t)path);
    if ((peVar3 != (ecs_type_t)0x0) && ((char *)0x1f < path)) {
      pcVar6 = ecs_get_path_w_sep((ecs_world_t *)id,0,(ecs_entity_t)path,0,"::",(char *)0x0);
      iVar2 = strcmp(pcVar6,pcStack_28);
      _ecs_assert((_Bool)((iVar2 != 0 ^ 0xffU) & 1),0x2a,pcStack_28,"!strcmp(path, name)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xe9b);
      iVar2 = strcmp(pcVar6,pcStack_28);
      if (iVar2 != 0) {
        __assert_fail("!strcmp(path, name)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xe9b,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
      (*ecs_os_api.free_)(pcVar6);
    }
    ecs_add_path_w_sep((ecs_world_t *)id,(ecs_entity_t)path,0,pcStack_28,"::","::");
    pwVar4 = flecs::world::c_ptr((world *)name_local);
    pcVar6 = path;
    size = _::component_info<Position>::size();
    alignment = _::component_info<Position>::alignment();
    pcVar6 = (char *)ecs_new_component(pwVar4,(ecs_entity_t)pcVar6,(char *)0x0,size,alignment);
    _ecs_assert(pcVar6 == path,0xc,(char *)0x0,"entity == id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xeb3);
    if (pcVar6 != path) {
      __assert_fail("entity == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                    ,0xeb3,
                    "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                   );
    }
  }
  else {
    entity_00 = ecs_lookup_path_w_sep((ecs_world_t *)id,0,pcStack_28,".",(char *)0x0);
    if (entity_00 != 0) {
      pwVar4 = flecs::world::c_ptr((world *)name_local);
      pvVar5 = ecs_get_mut_w_entity(pwVar4,entity_00,6,(_Bool *)0x0);
      _ecs_assert(pvVar5 != (void *)0x0,0xc,(char *)0x0,"name_comp != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xec3);
      if (pvVar5 == (void *)0x0) {
        __assert_fail("name_comp != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xec3,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
      _ecs_assert(*(long *)((long)pvVar5 + 8) != 0,0xc,(char *)0x0,"name_comp->symbol != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xec4);
      if (*(long *)((long)pvVar5 + 8) == 0) {
        __assert_fail("name_comp->symbol != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xec4,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
      pcVar6 = _::name_helper<Position>::name();
      iVar2 = strcmp(*(char **)((long)pvVar5 + 8),pcVar6);
      _ecs_assert((_Bool)((iVar2 != 0 ^ 0xffU) & 1),0x2f,pcStack_28,
                  "!strcmp(name_comp->symbol, symbol)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xec9);
      iVar2 = strcmp(*(char **)((long)pvVar5 + 8),pcVar6);
      if (iVar2 != 0) {
        __assert_fail("!strcmp(name_comp->symbol, symbol)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                      ,0xec9,
                      "flecs::entity flecs::pod_component(const flecs::world &, const char *, bool) [T = Position]"
                     );
      }
    }
    path = (char *)_::component_info<Position>::id_no_lifecycle
                             ((world_t *)id,pcStack_28,(bool)(world_ptr._7_1_ & 1));
  }
  _::component_info<Position>::init((EVP_PKEY_CTX *)id);
  _::component_info<const_Position>::init((EVP_PKEY_CTX *)id);
  _::component_info<Position_*>::init((EVP_PKEY_CTX *)id);
  _::component_info<Position_&>::init((EVP_PKEY_CTX *)id);
  eVar7 = flecs::world::entity<unsigned_long&>((world *)name_local,(unsigned_long *)&path);
  return eVar7;
}

Assistant:

flecs::entity pod_component(const flecs::world& world, const char *name = nullptr, bool allow_tag = true) {
    if (!name) {
        name = _::name_helper<T>::name();
    }

    world_t *world_ptr = world.c_ptr();
    entity_t id = 0;

    if (_::component_info<T>::registered()) {
        /* Obtain component id. Because the component is already registered,
         * this operation does nothing besides returning the existing id */
        id = _::component_info<T>::id_no_lifecycle(world_ptr, name, allow_tag);

        /* If entity is not empty check if the name matches */
        if (ecs_get_type(world_ptr, id) != nullptr) {
            if (id >= EcsFirstUserComponentId) {
                char *path = ecs_get_path_w_sep(
                    world_ptr, 0, id, 0, "::", nullptr);
                ecs_assert(!strcmp(path, name), 
                    ECS_INCONSISTENT_COMPONENT_NAME, name);
                ecs_os_free(path);
            }
        }

        /* Register name with entity, so that when the entity is created the
         * correct id will be resolved from the name. */
        ecs_add_path_w_sep(world_ptr, id, 0, name, "::", "::");

        /* If a component was already registered with this id but with a 
         * different size, the ecs_new_component function will fail. */

        /* We need to explicitly call ecs_new_component here again. Even though
         * the component was already registered, it may have been registered
         * with a different world. This ensures that the component is registered
         * with the same id for the current world. 
         * If the component was registered already, nothing will change. */
        ecs_entity_t entity = ecs_new_component(
            world.c_ptr(), id, nullptr, 
            _::component_info<T>::size(), 
            _::component_info<T>::alignment());
        
        (void)entity;
        
        ecs_assert(entity == id, ECS_INTERNAL_ERROR, NULL);

        /* This functionality could have been put in id_no_lifecycle, but since
         * this code happens when a component is registered, and the entire API
         * calls id_no_lifecycle, this would add a lot of overhead to each call.
         * This is why when using multiple worlds, components should be 
         * registered explicitly. */
    } else {
        /* If the component is not yet registered, ensure no other component
         * or entity has been registered with this name */
        ecs_entity_t entity = ecs_lookup_fullpath(world_ptr, name);

        /* If entity exists, compare symbol name to ensure that the component
         * we are trying to register under this name is the same */
        if (entity) {
            const EcsName *name_comp = ecs_get_mut(world.c_ptr(), entity, EcsName, NULL);
            ecs_assert(name_comp != NULL, ECS_INTERNAL_ERROR, NULL);
            ecs_assert(name_comp->symbol != NULL, ECS_INTERNAL_ERROR, NULL);

            const char *symbol = _::name_helper<T>::name();

            ecs_assert(!strcmp(name_comp->symbol, symbol), 
                ECS_COMPONENT_NAME_IN_USE, name);

            (void)name_comp;
            (void)symbol;
        }

        /* Register id as usual */
        id = _::component_info<T>::id_no_lifecycle(world_ptr, name, allow_tag);
    }

    _::component_info<T>::init(world_ptr, id, allow_tag);
    _::component_info<const T>::init(world_ptr, id, allow_tag);
    _::component_info<T*>::init(world_ptr, id, allow_tag);
    _::component_info<T&>::init(world_ptr, id, allow_tag);
    
    return world.entity(id);
}